

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::RunBullseyeSourceSummary
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  ostream *poVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  double local_13f0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1220;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1218;
  duration<long,_std::ratio<60L,_1L>_> local_1210;
  rep local_1208;
  allocator<char> local_11f9;
  string local_11f8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_11d8;
  allocator<char> local_11c9;
  string local_11c8;
  allocator<char> local_11a1;
  string local_11a0;
  double local_1180;
  allocator<char> local_1171;
  string local_1170;
  allocator<char> local_1149;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  undefined1 local_10d8 [8];
  string end_time;
  string local_10b0;
  allocator<char> local_1089;
  string local_1088;
  int local_1068;
  allocator<char> local_1061;
  string local_1060;
  int local_1040;
  allocator<char> local_1039;
  string local_1038;
  int local_1018;
  allocator<char> local_1011;
  string local_1010;
  allocator<char> local_fe9;
  string local_fe8;
  int local_fc8;
  allocator<char> local_fc1;
  string local_fc0;
  allocator<char> local_f99;
  string local_f98;
  char *local_f78;
  allocator<char> local_f69;
  string local_f68;
  float local_f48;
  float local_f44;
  float cmet;
  float cper;
  string shortFileName;
  string fileName;
  undefined1 local_ee0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_d68 [32];
  undefined1 local_d48 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_bc8 [7];
  bool shouldIDoCoverage;
  _Base_ptr local_ba8;
  undefined1 local_ba0;
  undefined1 local_b98 [8];
  string file;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFileNames;
  undefined1 local_b28 [8];
  ostringstream cmCTestLog_msg_2;
  long local_9b0;
  ifstream fin;
  undefined1 local_7a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFilesFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFiles;
  double number_files;
  double percent_coverage;
  double total_functions;
  double total_untested;
  double total_tested;
  int percentBranch;
  int totalBranches;
  int branchCovered;
  int percentFunction;
  int totalFunctions;
  int functionsCalled;
  string sourceFile;
  string errline;
  string stdline;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  undefined1 local_658 [8];
  string coverage_start_time;
  time_point elapsed_time_start;
  undefined1 local_610 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_498 [8];
  cmXMLWriter xml;
  cmGeneratedFileStream covSumFile;
  ostream *tmpLog;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_40 [8];
  string outputFile;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  outputFile.field_2._8_8_ = cont;
  std::__cxx11::string::string((string *)local_40);
  iVar4 = RunBullseyeCommand(this,(cmCTestCoverageHandlerContainer *)outputFile.field_2._8_8_,
                             "covsrc","-c",(string *)local_40);
  if (iVar4 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::operator<<((ostream *)local_1c8,"error running covsrc:\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x7b8,pcVar5,false);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    this_local._4_4_ = 0;
  }
  else {
    poVar6 = *(ostream **)(outputFile.field_2._8_8_ + 0x78);
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&xml.ElementOpen,None);
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_498,(ostream *)&xml.ElementOpen,0);
    bVar2 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartCoverage,"Coverage",
                       (cmGeneratedFileStream *)&xml.ElementOpen);
    if (bVar2) {
      cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_498,
                        (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
      coverage_start_time.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
      cmCTest::CurrentTime_abi_cxx11_((string *)local_658,(this->super_cmCTestGenericHandler).CTest)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"Coverage",&local_679)
      ;
      cmXMLWriter::StartElement((cmXMLWriter *)local_498,&local_678);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator(&local_679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"StartDateTime",&local_6a1);
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_498,&local_6a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c8,"StartTime",&local_6c9);
      stdline.field_2._8_8_ = std::chrono::_V2::system_clock::now();
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((cmXMLWriter *)local_498,&local_6c8,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)((long)&stdline.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_6c8);
      std::allocator<char>::~allocator(&local_6c9);
      std::__cxx11::string::string((string *)(errline.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(sourceFile.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&totalFunctions);
      percentFunction = 0;
      branchCovered = 0;
      totalBranches = 0;
      percentBranch = 0;
      total_tested._4_4_ = 0;
      total_tested._0_4_ = 0;
      total_untested = 0.0;
      total_functions = 0.0;
      percent_coverage = 0.0;
      number_files = 0.0;
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&coveredFilesFullPath.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_7a8);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_9b0,pcVar5,_S_in);
      bVar3 = std::ios::operator!((ios *)((long)&local_9b0 + *(long *)(local_9b0 + -0x18)));
      if ((bVar3 & 1) == 0) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&file.field_2 + 8));
        while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)&local_9b0,(string *)((long)&errline.field_2 + 8),
                                  (bool *)0x0,-1), bVar2) {
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            ParseBullsEyeCovsrcLine
                      (this,(string *)((long)&errline.field_2 + 8),(string *)&totalFunctions,
                       &percentFunction,&branchCovered,&totalBranches,&percentBranch,
                       (int *)((long)&total_tested + 4),(int *)&total_tested);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&totalFunctions,"Source");
            if ((!bVar2) &&
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&totalFunctions,"Total"), !bVar2)) {
              std::__cxx11::string::string((string *)local_b98,(string *)&totalFunctions);
              pVar9 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&file.field_2 + 8),(value_type *)local_b98);
              local_ba8 = (_Base_ptr)pVar9.first._M_node;
              local_ba0 = pVar9.second;
              bVar2 = cmsys::SystemTools::FileIsFullPath((string *)&totalFunctions);
              if (!bVar2) {
                std::__cxx11::string::operator=
                          ((string *)local_b98,(string *)(outputFile.field_2._8_8_ + 0x28));
                std::__cxx11::string::operator+=((string *)local_b98,"/");
                std::__cxx11::string::operator+=((string *)local_b98,(string *)&totalFunctions);
              }
              cmsys::SystemTools::CollapseFullPath((string *)local_bc8,(string *)local_b98);
              std::__cxx11::string::operator=((string *)local_b98,(string *)local_bc8);
              std::__cxx11::string::~string((string *)local_bc8);
              bVar2 = ShouldIDoCoverage(this,(string *)local_b98,
                                        (string *)(outputFile.field_2._8_8_ + 8),
                                        (string *)(outputFile.field_2._8_8_ + 0x28));
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ee0);
                poVar8 = std::operator<<((ostream *)local_ee0,"Doing coverage for: ");
                poVar8 = std::operator<<(poVar8,(string *)local_b98);
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x80a,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ee0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&coveredFilesFullPath.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type *)&totalFunctions);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_7a8,(value_type *)local_b98);
                coveredFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((double)coveredFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1.0);
                percent_coverage = percent_coverage + (double)branchCovered;
                total_untested = total_untested + (double)percentFunction;
                total_functions = total_functions + (double)(branchCovered - percentFunction);
                cmsys::SystemTools::GetFilenameName
                          ((string *)((long)&shortFileName.field_2 + 8),(string *)local_b98);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::GetShortPathToFile_abi_cxx11_((string *)&cmet,pcVar1,pcVar5);
                local_f44 = (float)(total_tested._0_4_ + totalBranches);
                if (0 < total_tested._4_4_) {
                  local_f44 = local_f44 / 2.0;
                }
                number_files = (double)local_f44 + number_files;
                local_f48 = (float)(totalBranches + total_tested._0_4_);
                if (0 < total_tested._4_4_) {
                  local_f48 = local_f48 / 2.0;
                }
                local_f48 = local_f48 / 100.0;
                poVar8 = std::operator<<(poVar6,(string *)(errline.field_2._M_local_buf + 8));
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,(string *)(shortFileName.field_2._M_local_buf + 8));
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"functionsCalled: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,percentFunction / 100);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"totalFunctions: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,branchCovered / 100);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"percentFunction: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,totalBranches);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"branchCovered: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,percentBranch);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"totalBranches: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,total_tested._4_4_);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"percentBranch: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,total_tested._0_4_);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"percentCoverage: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,number_files);
                std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar6,"coverage metric: ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_f48);
                std::operator<<(poVar8,"\n");
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f68,"File",&local_f69);
                cmXMLWriter::StartElement((cmXMLWriter *)local_498,&local_f68);
                std::__cxx11::string::~string((string *)&local_f68);
                std::allocator<char>::~allocator(&local_f69);
                cmXMLWriter::Attribute<std::__cxx11::string>
                          ((cmXMLWriter *)local_498,"Name",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &totalFunctions);
                cmXMLWriter::Attribute<std::__cxx11::string>
                          ((cmXMLWriter *)local_498,"FullPath",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmet);
                local_f78 = "false";
                if (0.0 < local_f48) {
                  local_f78 = "true";
                }
                cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)local_498,"Covered",&local_f78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f98,"BranchesTested",&local_f99);
                cmXMLWriter::Element<int>((cmXMLWriter *)local_498,&local_f98,&percentBranch);
                std::__cxx11::string::~string((string *)&local_f98);
                std::allocator<char>::~allocator(&local_f99);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_fc0,"BranchesUnTested",&local_fc1);
                local_fc8 = total_tested._4_4_ - percentBranch;
                cmXMLWriter::Element<int>((cmXMLWriter *)local_498,&local_fc0,&local_fc8);
                std::__cxx11::string::~string((string *)&local_fc0);
                std::allocator<char>::~allocator(&local_fc1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_fe8,"FunctionsTested",&local_fe9);
                cmXMLWriter::Element<int>((cmXMLWriter *)local_498,&local_fe8,&percentFunction);
                std::__cxx11::string::~string((string *)&local_fe8);
                std::allocator<char>::~allocator(&local_fe9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1010,"FunctionsUnTested",&local_1011);
                local_1018 = branchCovered - percentFunction;
                cmXMLWriter::Element<int>((cmXMLWriter *)local_498,&local_1010,&local_1018);
                std::__cxx11::string::~string((string *)&local_1010);
                std::allocator<char>::~allocator(&local_1011);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1038,"LOCTested",&local_1039);
                local_1040 = percentFunction * 100;
                cmXMLWriter::Element<int>((cmXMLWriter *)local_498,&local_1038,&local_1040);
                std::__cxx11::string::~string((string *)&local_1038);
                std::allocator<char>::~allocator(&local_1039);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1060,"LOCUnTested",&local_1061);
                local_1068 = (branchCovered - percentFunction) * 100;
                cmXMLWriter::Element<int>((cmXMLWriter *)local_498,&local_1060,&local_1068);
                std::__cxx11::string::~string((string *)&local_1060);
                std::allocator<char>::~allocator(&local_1061);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1088,"PercentCoverage",&local_1089);
                cmXMLWriter::Element<float>((cmXMLWriter *)local_498,&local_1088,&local_f44);
                std::__cxx11::string::~string((string *)&local_1088);
                std::allocator<char>::~allocator(&local_1089);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_10b0,"CoverageMetric",
                           (allocator<char> *)(end_time.field_2._M_local_buf + 0xf));
                cmXMLWriter::Element<float>((cmXMLWriter *)local_498,&local_10b0,&local_f48);
                std::__cxx11::string::~string((string *)&local_10b0);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(end_time.field_2._M_local_buf + 0xf));
                WriteXMLLabels(this,(cmXMLWriter *)local_498,(string *)&cmet);
                cmXMLWriter::EndElement((cmXMLWriter *)local_498);
                std::__cxx11::string::~string((string *)&cmet);
                std::__cxx11::string::~string((string *)(shortFileName.field_2._M_local_buf + 8));
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d48);
                poVar8 = std::operator<<((ostream *)local_d48,
                                         ".NoDartCoverage found, so skip coverage check for: ");
                poVar8 = std::operator<<(poVar8,(string *)local_b98);
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x804,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string(local_d68);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d48);
              }
              std::__cxx11::string::~string((string *)local_b98);
            }
          }
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_10d8,(this->super_cmCTestGenericHandler).CTest);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10f8,"LOCTested",&local_10f9);
        cmXMLWriter::Element<double>((cmXMLWriter *)local_498,&local_10f8,&total_untested);
        std::__cxx11::string::~string((string *)&local_10f8);
        std::allocator<char>::~allocator(&local_10f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1120,"LOCUntested",&local_1121);
        cmXMLWriter::Element<double>((cmXMLWriter *)local_498,&local_1120,&total_functions);
        std::__cxx11::string::~string((string *)&local_1120);
        std::allocator<char>::~allocator(&local_1121);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1148,"LOC",&local_1149);
        cmXMLWriter::Element<double>((cmXMLWriter *)local_498,&local_1148,&percent_coverage);
        std::__cxx11::string::~string((string *)&local_1148);
        std::allocator<char>::~allocator(&local_1149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1170,"PercentCoverage",&local_1171);
        if (((double)coveredFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage != 0.0) ||
           (NAN((double)coveredFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage))) {
          local_13f0 = number_files /
                       (double)coveredFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          local_13f0 = 0.0;
        }
        local_1180 = local_13f0;
        cmXMLWriter::Element<double>((cmXMLWriter *)local_498,&local_1170,&local_1180);
        std::__cxx11::string::~string((string *)&local_1170);
        std::allocator<char>::~allocator(&local_1171);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11a0,"EndDateTime",&local_11a1);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_498,&local_11a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8);
        std::__cxx11::string::~string((string *)&local_11a0);
        std::allocator<char>::~allocator(&local_11a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11c8,"EndTime",&local_11c9);
        local_11d8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((cmXMLWriter *)local_498,&local_11c8,&local_11d8);
        std::__cxx11::string::~string((string *)&local_11c8);
        std::allocator<char>::~allocator(&local_11c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11f8,"ElapsedMinutes",&local_11f9);
        local_1220.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        local_1218.__r =
             (rep)std::chrono::operator-
                            (&local_1220,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)((long)&coverage_start_time.field_2 + 8));
        local_1210.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                            (&local_1218);
        local_1208 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1210);
        cmXMLWriter::Element<long>((cmXMLWriter *)local_498,&local_11f8,&local_1208);
        std::__cxx11::string::~string((string *)&local_11f8);
        std::allocator<char>::~allocator(&local_11f9);
        cmXMLWriter::EndElement((cmXMLWriter *)local_498);
        cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_498);
        this_local._4_4_ =
             RunBullseyeCoverageBranch
                       (this,(cmCTestCoverageHandlerContainer *)outputFile.field_2._8_8_,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&file.field_2 + 8),
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&coveredFilesFullPath.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_7a8);
        std::__cxx11::string::~string((string *)local_10d8);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&file.field_2 + 8));
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
        poVar6 = std::operator<<((ostream *)local_b28,"Cannot open coverage summary file: ");
        poVar6 = std::operator<<(poVar6,(string *)local_40);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x7e5,pcVar5,false);
        std::__cxx11::string::~string
                  ((string *)&coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
        this_local._4_4_ = 0;
      }
      std::ifstream::~ifstream(&local_9b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_7a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&coveredFilesFullPath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&totalFunctions);
      std::__cxx11::string::~string((string *)(sourceFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(errline.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_658);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      poVar6 = std::operator<<((ostream *)local_610,"Cannot open coverage summary file.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x7c3,pcVar5,false);
      std::__cxx11::string::~string((string *)&elapsed_time_start);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
      this_local._4_4_ = 0;
    }
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_498);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&xml.ElementOpen);
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeSourceSummary(
  cmCTestCoverageHandlerContainer* cont)
{
  // Run the covsrc command and create a temp outputfile
  std::string outputFile;
  if (!this->RunBullseyeCommand(cont, "covsrc", "-c", outputFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "error running covsrc:\n");
    return 0;
  }

  std::ostream& tmpLog = *cont->OFS;
  // copen the Coverage.xml file in the Testing directory
  cmGeneratedFileStream covSumFile;
  cmXMLWriter xml(covSumFile);
  if (!this->StartResultingXML(cmCTest::PartCoverage, "Coverage",
                               covSumFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage summary file." << std::endl);
    return 0;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string coverage_start_time = this->CTest->CurrentTime();
  xml.StartElement("Coverage");
  xml.Element("StartDateTime", coverage_start_time);
  xml.Element("StartTime", std::chrono::system_clock::now());
  std::string stdline;
  std::string errline;
  // expected output:
  // first line is:
  // "Source","Function Coverage","out of","%","C/D Coverage","out of","%"
  // after that data follows in that format
  std::string sourceFile;
  int functionsCalled = 0;
  int totalFunctions = 0;
  int percentFunction = 0;
  int branchCovered = 0;
  int totalBranches = 0;
  int percentBranch = 0;
  double total_tested = 0;
  double total_untested = 0;
  double total_functions = 0;
  double percent_coverage = 0;
  double number_files = 0;
  std::vector<std::string> coveredFiles;
  std::vector<std::string> coveredFilesFullPath;
  // Read and parse the summary output file
  cmsys::ifstream fin(outputFile.c_str());
  if (!fin) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage summary file: " << outputFile
                                                     << std::endl);
    return 0;
  }
  std::set<std::string> coveredFileNames;
  while (cmSystemTools::GetLineFromStream(fin, stdline)) {
    // if we have a line of output from stdout
    if (!stdline.empty()) {
      // parse the comma separated output
      this->ParseBullsEyeCovsrcLine(
        stdline, sourceFile, functionsCalled, totalFunctions, percentFunction,
        branchCovered, totalBranches, percentBranch);
      // The first line is the header
      if (sourceFile == "Source" || sourceFile == "Total") {
        continue;
      }
      std::string file = sourceFile;
      coveredFileNames.insert(file);
      if (!cmSystemTools::FileIsFullPath(sourceFile)) {
        // file will be relative to the binary dir
        file = cont->BinaryDir;
        file += "/";
        file += sourceFile;
      }
      file = cmSystemTools::CollapseFullPath(file);
      bool shouldIDoCoverage =
        this->ShouldIDoCoverage(file, cont->SourceDir, cont->BinaryDir);
      if (!shouldIDoCoverage) {
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          ".NoDartCoverage found, so skip coverage check for: " << file
                                                                << std::endl,
          this->Quiet);
        continue;
      }

      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Doing coverage for: " << file << std::endl,
                         this->Quiet);

      coveredFiles.push_back(sourceFile);
      coveredFilesFullPath.push_back(file);

      number_files++;
      total_functions += totalFunctions;
      total_tested += functionsCalled;
      total_untested += (totalFunctions - functionsCalled);

      std::string fileName = cmSystemTools::GetFilenameName(file);
      std::string shortFileName =
        this->CTest->GetShortPathToFile(file.c_str());

      float cper = static_cast<float>(percentBranch + percentFunction);
      if (totalBranches > 0) {
        cper /= 2.0f;
      }
      percent_coverage += static_cast<double>(cper);
      float cmet = static_cast<float>(percentFunction + percentBranch);
      if (totalBranches > 0) {
        cmet /= 2.0f;
      }
      cmet /= 100.0f;
      tmpLog << stdline << "\n";
      tmpLog << fileName << "\n";
      tmpLog << "functionsCalled: " << functionsCalled / 100 << "\n";
      tmpLog << "totalFunctions: " << totalFunctions / 100 << "\n";
      tmpLog << "percentFunction: " << percentFunction << "\n";
      tmpLog << "branchCovered: " << branchCovered << "\n";
      tmpLog << "totalBranches: " << totalBranches << "\n";
      tmpLog << "percentBranch: " << percentBranch << "\n";
      tmpLog << "percentCoverage: " << percent_coverage << "\n";
      tmpLog << "coverage metric: " << cmet << "\n";
      xml.StartElement("File");
      xml.Attribute("Name", sourceFile);
      xml.Attribute("FullPath", shortFileName);
      xml.Attribute("Covered", cmet > 0 ? "true" : "false");
      xml.Element("BranchesTested", branchCovered);
      xml.Element("BranchesUnTested", totalBranches - branchCovered);
      xml.Element("FunctionsTested", functionsCalled);
      xml.Element("FunctionsUnTested", totalFunctions - functionsCalled);
      // Hack for conversion of function to loc assume a function
      // has 100 lines of code
      xml.Element("LOCTested", functionsCalled * 100);
      xml.Element("LOCUnTested", (totalFunctions - functionsCalled) * 100);
      xml.Element("PercentCoverage", cper);
      xml.Element("CoverageMetric", cmet);
      this->WriteXMLLabels(xml, shortFileName);
      xml.EndElement(); // File
    }
  }
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("LOCTested", total_tested);
  xml.Element("LOCUntested", total_untested);
  xml.Element("LOC", total_functions);
  xml.Element("PercentCoverage", SAFEDIV(percent_coverage, number_files));
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());
  xml.EndElement(); // Coverage
  this->CTest->EndXML(xml);

  // Now create the coverage information for each file
  return this->RunBullseyeCoverageBranch(cont, coveredFileNames, coveredFiles,
                                         coveredFilesFullPath);
}